

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bompiprobe.c
# Opt level: O2

int measure_lincost(int pid,int nprocs,int repeat,int msg_size,int total_size,int min_niters,
                   int niters,int ncomms,conf_interval_method_t conf_interval_method,int *n_samples,
                   char *sample_file_name,double *alpha_msg,double *alpha_msg_min,
                   double *alpha_msg_max,double *alpha_rma,double *alpha_rma_min,
                   double *alpha_rma_max,double *beta_msg,double *beta_msg_min,double *beta_msg_max,
                   double *beta_rma,double *beta_rma_min,double *beta_rma_max,double *beta_memcpy,
                   double *beta_memcpy_min,double *beta_memcpy_max,double conf_level)

{
  int iVar1;
  MPI_Comm comm;
  ulong uVar2;
  char *pcVar3;
  void *data;
  char *__s;
  FILE *__s_00;
  void *pvVar4;
  void *pvVar5;
  undefined8 *__ptr;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 *puVar14;
  uint *puVar15;
  int iVar16;
  long lVar17;
  double *pdVar18;
  size_t sVar19;
  long lVar20;
  int iVar21;
  undefined8 *puVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined8 in_stack_fffffffffffffe48;
  int glob_error;
  uint local_194;
  int local_190;
  int local_18c;
  double local_188;
  ulong local_180;
  char *local_178;
  uint local_16c;
  void *local_168;
  double local_160;
  char *local_158;
  size_t rng;
  size_t local_148;
  void *local_140;
  undefined8 local_138;
  MPI_Request *local_130;
  void *local_128;
  FILE *local_120;
  int local_114;
  double local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  double T_max [6];
  double T_min [6];
  double T [6];
  int o [7];
  
  local_138 = CONCAT44(in_register_0000000c,msg_size);
  rng = 0;
  glob_error = 0;
  local_188 = (double)CONCAT44(local_188._4_4_,nprocs);
  local_160 = (double)((long)total_size / (long)msg_size & 0xffffffff);
  *n_samples = 0;
  local_190 = pid;
  local_18c = repeat;
  local_110 = conf_level;
  if (sample_file_name == (char *)0x0 || pid != 0) {
    local_194 = 0;
  }
  else {
    __s_00 = fopen(sample_file_name,"w");
    if (__s_00 != (FILE *)0x0) {
      fwrite("#ID\tSTAMP\tMETHOD\tTOPOLOGY\tMSG_SIZE\tH_REL\tTIME\n",0x2e,1,__s_00);
      local_194 = 0;
      goto LAB_0010a35d;
    }
    local_194 = 1;
  }
  __s_00 = (FILE *)0x0;
LAB_0010a35d:
  MPI_Allreduce(&local_194,&glob_error,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  if (glob_error == 0) {
    local_16c = total_size * 2;
    sVar19 = (size_t)(int)local_16c;
    lVar17 = 1;
    local_120 = __s_00;
    local_114 = min_niters;
    local_158 = (char *)calloc(sVar19,1);
    local_148 = sVar19;
    local_178 = (char *)calloc(sVar19,1);
    local_f8 = (size_t)niters;
    local_180 = (ulong)(uint)niters;
    pvVar4 = calloc(local_f8,0x28);
    local_f0 = (size_t)(SUB84(local_160,0) * 2);
    uVar12 = 8;
    local_130 = (MPI_Request *)calloc(local_f0,8);
    local_100 = (size_t)local_188._0_4_;
    local_128 = calloc(local_100,4);
    sVar19 = (size_t)ncomms;
    pvVar5 = calloc(sVar19,8);
    local_108 = sVar19;
    __ptr = (undefined8 *)calloc(sVar19,8);
    __s = local_158;
    pcVar3 = local_178;
    if (__ptr != (undefined8 *)0x0) {
      uVar6 = 0;
      uVar9 = 0;
      if (0 < ncomms) {
        uVar9 = (ulong)(uint)ncomms;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        __ptr[uVar6] = &ompi_mpi_comm_null;
      }
    }
    if (pvVar5 != (void *)0x0) {
      uVar6 = 0;
      uVar9 = 0;
      if (0 < ncomms) {
        uVar9 = (ulong)(uint)ncomms;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined **)((long)pvVar5 + uVar6 * 8) = &ompi_mpi_win_null;
      }
    }
    auVar24._0_4_ = -(uint)((int)((ulong)local_158 >> 0x20) == 0 && (int)local_158 == 0);
    auVar24._4_4_ = -(uint)((int)local_178 == 0 && (int)((ulong)local_178 >> 0x20) == 0);
    auVar24._8_4_ = -(uint)((int)pvVar4 == 0 && (int)((ulong)pvVar4 >> 0x20) == 0);
    auVar24._12_4_ = -(uint)((int)local_130 == 0 && (int)((ulong)local_130 >> 0x20) == 0);
    iVar13 = movmskps(uVar12,auVar24);
    local_194 = (uint)(((__ptr == (undefined8 *)0x0 || pvVar5 == (void *)0x0) ||
                       local_128 == (void *)0x0) || iVar13 != 0);
    local_168 = pvVar4;
    local_140 = pvVar5;
    MPI_Allreduce(&local_194,&glob_error,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
    sVar19 = local_148;
    if (glob_error == 0) {
      local_16c = (uint)(10.0 / (1.0 - local_110));
      memset(__s,1,local_148);
      memset(pcVar3,2,sVar19);
      uVar6 = 0;
      uVar9 = 0;
      if (0 < local_188._0_4_) {
        uVar9 = (ulong)local_188 & 0xffffffff;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *(int *)((long)local_128 + uVar6 * 4) = (int)uVar6;
      }
      MPI_Comm_dup(&ompi_mpi_comm_world,__ptr);
      pvVar4 = local_140;
      MPI_Win_create(pcVar3,local_148,1,&ompi_mpi_info_null,*__ptr,local_140);
      pvVar5 = local_128;
      lVar20 = (long)local_190;
      puVar22 = __ptr;
      while( true ) {
        data = local_168;
        puVar22 = puVar22 + 1;
        pvVar4 = (void *)((long)pvVar4 + 8);
        if ((long)local_108 <= lVar17) break;
        permute(&rng,pvVar5,local_188._0_4_,4);
        MPI_Comm_split(*__ptr,0,*(undefined4 *)((long)pvVar5 + lVar20 * 4),puVar22);
        MPI_Win_create(local_178,local_148,1,&ompi_mpi_info_null,*puVar22,pvVar4);
        lVar17 = lVar17 + 1;
      }
      uVar6 = 0;
      uVar9 = 0;
      if (0 < niters) {
        uVar9 = (ulong)(uint)niters;
      }
      piVar10 = (int *)((long)local_168 + 0xc);
      for (; iVar13 = (int)local_138, uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *piVar10 = (((uint)uVar6 & 1) + 1) * iVar13;
        piVar10 = piVar10 + 10;
      }
      permute(&rng,local_168,niters,0x28);
      puVar14 = (undefined4 *)((long)data + 8);
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *puVar14 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                        (long)(SUB84(local_160,0) + 1));
        puVar14 = puVar14 + 10;
      }
      permute(&rng,data,niters,0x28);
      puVar14 = (undefined4 *)((long)data + 0x10);
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *puVar14 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                        (long)ncomms);
        puVar14 = puVar14 + 10;
      }
      permute(&rng,data,niters,0x28);
      uVar7 = 0;
      for (lVar17 = 0; uVar9 * 0x28 - lVar17 != 0; lVar17 = lVar17 + 0x28) {
        *(uint *)((long)data + lVar17 + 0x14) = uVar7 % 3;
        uVar7 = uVar7 + 1;
      }
      permute(&rng,data,niters,0x28);
      pcVar3 = local_158;
      iVar21 = local_18c;
      iVar13 = iVar13 * 2;
      local_148 = CONCAT44(local_148._4_4_,iVar13);
      uVar6 = 0;
      local_188 = 0.0;
      if (0 < ncomms) {
        local_188 = (double)(ulong)(uint)ncomms;
      }
      for (; local_188 != (double)uVar6; uVar6 = uVar6 + 1) {
        in_stack_fffffffffffffe48 = CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),iVar21)
        ;
        iVar16 = SUB84(local_160,0);
        measure_hrel_msg((MPI_Comm)__ptr[uVar6],pcVar3,local_178,local_130,iVar16,iVar13,iVar21);
        measure_hrel_rma((MPI_Comm)__ptr[uVar6],*(MPI_Win *)((long)local_140 + uVar6 * 8),pcVar3,
                         iVar16,iVar13,iVar21);
        measure_hrel_memcpy((MPI_Comm)__ptr[uVar6],pcVar3,local_178,iVar16,iVar13,iVar21);
      }
      local_188 = bsp_time();
      lVar17 = (long)local_114;
      pdVar18 = (double *)((long)local_168 + 0x20);
      iVar13 = -1;
      lVar20 = 0;
      local_160 = local_188;
      while( true ) {
        uVar7 = (uint)lVar20;
        if ((int)local_180 <= lVar20) break;
        iVar21 = *(int *)(pdVar18 + -3);
        iVar16 = *(int *)((long)pdVar18 + -0x14);
        comm = (MPI_Comm)__ptr[*(int *)(pdVar18 + -2)];
        iVar1 = *(int *)((long)pdVar18 + -0xc);
        if (iVar1 == 2) {
          dVar23 = measure_hrel_memcpy(comm,local_158,local_178,iVar21,iVar16,local_18c);
        }
        else if (iVar1 == 1) {
          in_stack_fffffffffffffe48 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),local_18c);
          dVar23 = measure_hrel_msg(comm,local_158,local_178,local_130,iVar21,iVar16,local_18c);
        }
        else {
          dVar23 = INFINITY;
          if (iVar1 == 0) {
            dVar23 = measure_hrel_rma(comm,*(MPI_Win *)
                                            ((long)local_140 + (long)*(int *)(pdVar18 + -2) * 8),
                                      local_158,iVar21,iVar16,local_18c);
          }
        }
        pdVar18[-4] = dVar23;
        dVar23 = bsp_time();
        *pdVar18 = dVar23 - local_160;
        *(uint *)(pdVar18 + -1) = uVar7;
        if ((local_190 == 0) && (dVar23 = bsp_time(), 10.0 < dVar23 - local_188)) {
          dVar23 = bsp_time();
          printf("# Sample time remaining: %.0f seconds\n#    (Press CTRL+C to interrupt)\n",
                 ((dVar23 - local_160) / (double)(int)uVar7) * (double)((int)local_180 + iVar13));
          local_188 = bsp_time();
        }
        MPI_Allreduce(&s_interrupted,&glob_error,1,&ompi_mpi_int,&ompi_mpi_op_max,
                      &ompi_mpi_comm_world);
        iVar16 = 8;
        if (lVar17 < lVar20) {
          iVar16 = 0x1e;
        }
        uVar8 = (uint)local_180;
        if (lVar17 < lVar20) {
          uVar8 = uVar7;
        }
        if (glob_error == 0) {
          iVar16 = 0;
        }
        local_180 = local_180 & 0xffffffff;
        if (glob_error != 0) {
          local_180 = (ulong)uVar8;
        }
        if (iVar16 != 0) {
          iVar21 = (int)local_138;
          if (iVar16 == 8) goto LAB_0010a596;
          if (iVar16 != 0x1e) {
            return iVar13;
          }
          goto LAB_0010aac9;
        }
        lVar20 = lVar20 + 1;
        pdVar18 = pdVar18 + 5;
        iVar13 = iVar13 + -1;
      }
      iVar21 = (int)local_138;
LAB_0010aac9:
      if (local_120 != (FILE *)0x0) {
        lVar17 = 0;
        uVar6 = 0;
        if (0 < (int)local_180) {
          uVar6 = local_180 & 0xffffffff;
        }
        for (; uVar6 * 0x28 - lVar17 != 0; lVar17 = lVar17 + 0x28) {
          in_stack_fffffffffffffe48 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                        *(undefined4 *)((long)local_168 + lVar17 + 8));
          fprintf(local_120,"%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                  *(undefined8 *)((long)local_168 + lVar17 + 0x20),
                  *(undefined8 *)((long)local_168 + lVar17),
                  (ulong)*(uint *)((long)local_168 + lVar17 + 0x18),
                  (ulong)*(uint *)((long)local_168 + lVar17 + 0x14),
                  (ulong)*(uint *)((long)local_168 + lVar17 + 0x10),
                  (ulong)*(uint *)((long)local_168 + lVar17 + 0xc),in_stack_fffffffffffffe48);
        }
        fclose(local_120);
        iVar21 = (int)local_138;
      }
      pvVar4 = local_168;
      sVar19 = (size_t)(int)local_180;
      qsort(local_168,sVar19,0x28,cmp_lincost_sample);
      o[0] = 0;
      uVar6 = 0;
      for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
        uVar11 = (ulong)(int)uVar6;
        uVar2 = local_180;
        if ((int)local_180 < (int)uVar6) {
          uVar2 = uVar6;
        }
        for (puVar15 = (uint *)((long)pvVar4 + uVar11 * 0x28 + 0x14);
            ((uVar6 = uVar2 & 0xffffffff, (long)uVar11 < (long)sVar19 &&
             (uVar6 = uVar11, puVar15[-2] == (((uint)uVar9 & 1) + 1) * iVar21)) &&
            (*puVar15 == ((uint)(uVar9 >> 1) & 0x7fffffff))); puVar15 = puVar15 + 10) {
          uVar11 = uVar11 + 1;
        }
        o[uVar9 + 1] = (int)uVar6;
      }
      local_194 = (*conf_interval_method)
                            (&rng,pvVar4,0x28,lincost_samples_get_hrel_time,o,6,local_110,local_16c,
                             T,T_min,T_max);
      MPI_Allreduce(&local_194,&glob_error,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
      if (glob_error == 0) {
        *alpha_rma = (T[0] + T[0]) - T[1];
        *alpha_rma_min = (T_min[0] + T_min[0]) - T_max[1];
        *alpha_rma_max = (T_max[0] + T_max[0]) - T_min[1];
        *alpha_msg = (T[2] + T[2]) - T[3];
        *alpha_msg_min = (T_min[2] + T_min[2]) - T_max[3];
        dVar23 = (double)iVar21;
        *alpha_msg_max = (T_max[2] + T_max[2]) - T_min[3];
        *beta_rma = (T[1] - T[0]) / dVar23;
        *beta_rma_min = (T_min[1] - T_max[0]) / dVar23;
        *beta_rma_max = (T_max[1] - T_min[0]) / dVar23;
        *beta_msg = (T[3] - T[2]) / dVar23;
        *beta_msg_min = (T_min[3] - T_max[2]) / dVar23;
        *beta_msg_max = (T_max[3] - T_min[2]) / dVar23;
        *beta_memcpy = (T[5] - T[4]) / dVar23;
        *beta_memcpy_min = (T_min[5] - T_max[4]) / dVar23;
        *beta_memcpy_max = (T_max[5] - T_min[4]) / dVar23;
        *n_samples = (int)local_180;
      }
    }
    else if (local_190 == 0) {
      fprintf(_stderr,
              "Insufficient memory. For a benchmark on %d processes I require 2x %d bytes of memory for send and receive buffers, %ld bytes for storing the measurements, %ld bytes for the request queue, %ld bytes for communication infrastructure\n"
              ,local_100,(ulong)local_16c,local_f8 * 0x28,local_f0 << 3,
              local_108 * 0x10 + local_100 * 4);
    }
LAB_0010a596:
    pcVar3 = local_158;
    uVar9 = 0;
    uVar6 = (ulong)(uint)ncomms;
    if (ncomms < 1) {
      uVar6 = uVar9;
    }
    for (; uVar6 * 8 != uVar9; uVar9 = uVar9 + 8) {
      if (*(undefined **)((long)local_140 + uVar9) != &ompi_mpi_win_null) {
        MPI_Win_free((long)local_140 + uVar9);
      }
      if (*(undefined **)((long)__ptr + uVar9) != &ompi_mpi_comm_null) {
        MPI_Comm_free((long)__ptr + uVar9);
      }
    }
    free(pcVar3);
    free(local_178);
    free(local_168);
    free(local_130);
    free(__ptr);
    free(local_128);
    free(local_140);
    iVar13 = glob_error;
  }
  else {
    iVar13 = 1;
    if (local_190 == 0) {
      fprintf(_stderr,"Could not open file \'%s\' for writing sample data\n",sample_file_name);
    }
  }
  return iVar13;
}

Assistant:

int measure_lincost( int pid, int nprocs, int repeat,
        int msg_size, int total_size, int min_niters, int niters, int ncomms,
        conf_interval_method_t conf_interval_method,
        int * n_samples, 
        const char * sample_file_name,
        double * alpha_msg, double * alpha_msg_min, double * alpha_msg_max, 
        double * alpha_rma, double * alpha_rma_min, double * alpha_rma_max, 
        double * beta_msg, double * beta_msg_min, double * beta_msg_max,
        double * beta_rma, double * beta_rma_min, double * beta_rma_max,
        double * beta_memcpy, double *beta_memcpy_min, double *beta_memcpy_max,
        double conf_level )
{
    char * sendbuf, * recvbuf;
    lincost_sample_t * samples;
    size_t rng = 0;
    int i, k, my_error=0, glob_error=0;
    MPI_Request * reqs = 0; 
    int * pid_perms;
    MPI_Win * wins;  MPI_Comm * comms;
    const int n_avgs = (int) (10.0 / (1.0 - conf_level));
    const int max_h = total_size / msg_size;
    int o[7];  /* two methods x two msg sizes + 1 */
    double T[6], T_min[6], T_max[6]; /* two methods x two msg sizes */
    FILE * sample_file;
    double t0, t1;

    * n_samples = 0;

    if ( pid == 0 && sample_file_name ) {
        sample_file = fopen( sample_file_name, "w" );
        if (sample_file) {
            fprintf( sample_file, "#ID\tSTAMP\tMETHOD\tTOPOLOGY\t"
                                  "MSG_SIZE\tH_REL\tTIME\n" );
            my_error = 0;
        }
        else {
            my_error = 1;
        }
    }
    else {
        sample_file = NULL;
        my_error = 0;
    }

    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Could not open file '%s' for writing sample data\n",
                sample_file_name );
        return 1;
    }
 

    /* allocate memory */
    sendbuf = calloc( 2* total_size, 1 );
    recvbuf = calloc( 2* total_size, 1 );
    samples =  calloc( niters, sizeof(samples[0]) );
    reqs = calloc( 2*max_h, sizeof(MPI_Request) );
    pid_perms = calloc( nprocs, sizeof(pid_perms[0]) );
    wins = calloc( ncomms, sizeof(MPI_Win) );
    comms = calloc( ncomms, sizeof(MPI_Comm) ); 

    if (comms) {
        for ( i = 0; i < ncomms; ++i )
            comms[i] = MPI_COMM_NULL;
    }
    if (wins) { 
        for ( i = 0; i < ncomms; ++i) 
            wins[i] = MPI_WIN_NULL;
    }

    my_error = !sendbuf || !recvbuf || !samples || !reqs
            || !pid_perms || !wins || !comms;
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Insufficient memory. For a benchmark on "
                "%d processes I require 2x %d bytes of memory "
                "for send and receive buffers, %ld bytes for "
                "storing the measurements, %ld bytes for "
                "the request queue, %ld bytes for "
                "communication infrastructure\n",
                nprocs,  2*total_size,
                (long) niters * (long) sizeof(samples[0]),
                2*max_h * (long) sizeof(MPI_Request),
               ncomms * (long) sizeof(MPI_Win) +
               ncomms * (long) sizeof(MPI_Comm) +
               nprocs * (long) sizeof(pid_perms[0]) );
        goto exit;
    }

    memset( sendbuf, 1, 2*total_size );
    memset( recvbuf, 2, 2*total_size );

    /* Create random topologies */
    for ( i = 0 ; i < nprocs; ++i )
        pid_perms[i] = i;

    MPI_Comm_dup( MPI_COMM_WORLD, &comms[0] );
    MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[0], & wins[0] );

    for ( i = 1; i < ncomms; ++i ) {
        permute( &rng, pid_perms, nprocs, sizeof(pid_perms[0]) );

        MPI_Comm_split( comms[0], 0, pid_perms[pid], &comms[i] );
        MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[i], & wins[i] );
    }

    /* Create measurement points */
    for ( i = 0 ; i < niters; ++i )
        samples[i].msg_size = (i%2 + 1) * msg_size;

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i ) 
        samples[i].h = i % ( max_h + 1);

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i )
       samples[i].comm = i % ncomms; 

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0 ; i < niters; ++i )
        samples[i].method = i % 3;

    permute( &rng, samples, niters, sizeof(samples[0]) );


    /* Warm up */
    for ( i = 0; i < ncomms; ++i ) {
        measure_hrel_msg( comms[i], sendbuf, recvbuf, reqs, 
                max_h, 2*msg_size, repeat );
        measure_hrel_rma( comms[i], wins[i], sendbuf, 
                max_h, 2*msg_size, repeat );
        measure_hrel_memcpy( comms[i], sendbuf, recvbuf, 
                max_h, 2*msg_size, repeat );
    }

    /* And now the measurements */
    t0 = t1 = bsp_time();
    for ( i = 0; i < niters; ++i ) {
        double t = HUGE_VAL;
        int h    = samples[i].h;
        int size = samples[i].msg_size;
        MPI_Comm comm = comms[ samples[i].comm ];
        MPI_Win win = wins[ samples[i].comm ];

        switch( samples[i].method ) {
            case 0: t = measure_hrel_rma( comm, win, sendbuf, 
                                          h, size, repeat );
                    break;
            case 1: t = measure_hrel_msg( comm, sendbuf, recvbuf, reqs, 
                                          h, size, repeat );
                    break;
            case 2: t = measure_hrel_memcpy( comm, sendbuf, recvbuf,
                                          h, size, repeat );
                    break;
        }

        samples[i].time = t;
        samples[i].timestamp = bsp_time() - t0;
        samples[i].serial = i;

        if ( !pid && bsp_time() - t1 > 10.0 ) {
            printf("# Sample time remaining: %.0f seconds\n"
                   "#    (Press CTRL+C to interrupt)\n",
                    (bsp_time() - t0) / i *(niters - i - 1) );
            t1 = bsp_time();
        }

        MPI_Allreduce( &s_interrupted, &glob_error, 1, MPI_INT,
                MPI_MAX, MPI_COMM_WORLD );
        if ( glob_error ) { 
            if (i > min_niters) {
                niters = i;
                break;
            }
            else {
                goto exit;
            }
        }
    } 

    /* Saving data */
    if (sample_file) {
        for ( i = 0; i < niters; ++i ) {
            fprintf( sample_file, 
                      "%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                      samples[i].serial, samples[i].timestamp,
                      samples[i].method, samples[i].comm,
                      samples[i].msg_size, samples[i].h, samples[i].time );
        }
        fclose( sample_file );
        sample_file = NULL;
    }

    /* Analysis */

    /* sort on (msg_size, method) */
    qsort( samples, niters, sizeof(samples[0]), cmp_lincost_sample );
    
    /* create an index to each (msg_size, method) in array 'o' */
    o[0] = 0;
    i = 0;
    for ( k = 0; k < 6; ++k ) {
        for ( ; i < niters; ++i )
            if (samples[i].msg_size != (k%2+1)*msg_size
                || samples[i].method != (k/2) )
                break;

        o[k+1] = i;
    }
 
    my_error = (*conf_interval_method)( &rng, samples, sizeof(samples[0]), 
           lincost_samples_get_hrel_time, 
           o, 6, conf_level, n_avgs,
           T, T_min, T_max );
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if (glob_error) {
        goto exit;
    }
   
    /* saving results */
    *alpha_rma     = 2*T[0] - T[1];
    *alpha_rma_min = 2*T_min[0] - T_max[1];
    *alpha_rma_max = 2*T_max[0] - T_min[1];

    *alpha_msg     = 2*T[2] - T[3];
    *alpha_msg_min = 2*T_min[2] - T_max[3];
    *alpha_msg_max = 2*T_max[2] - T_min[3];

    *beta_rma = (T[1] - T[0])/msg_size ;
    *beta_rma_min = (T_min[1] - T_max[0])/msg_size;
    *beta_rma_max = (T_max[1] - T_min[0])/msg_size;

    *beta_msg = (T[3] - T[2])/msg_size ;
    *beta_msg_min = (T_min[3] - T_max[2])/msg_size;
    *beta_msg_max = (T_max[3] - T_min[2])/msg_size;

    *beta_memcpy = (T[5] - T[4])/msg_size ;
    *beta_memcpy_min = (T_min[5] - T_max[4])/msg_size;
    *beta_memcpy_max = (T_max[5] - T_min[4])/msg_size;

    *n_samples = niters;

exit:
    /* free resources */
    for ( i = 0; i < ncomms; ++i ) {
        if (wins[i] != MPI_WIN_NULL)
            MPI_Win_free( &wins[i] );

        if (comms[i] != MPI_COMM_NULL )
            MPI_Comm_free( &comms[i] );
    }

    free( sendbuf );
    free( recvbuf );
    free( samples );
    free( reqs );
    free( comms );
    free( pid_perms );
    free( wins );
    
    return glob_error;
}